

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O3

bool vkt::anon_unknown_0::verifyStencilAttachment
               (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                *reference,ConstPixelBufferAccess *result,PixelBufferAccess *errorImage)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int y;
  Vec4 *color;
  int iVar5;
  bool bVar6;
  Maybe<bool> maybeValue;
  Vec4 local_58;
  Vec4 local_48;
  
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 1.0;
  iVar5 = (result->m_size).m_data[1];
  if (iVar5 < 1) {
    bVar6 = true;
  }
  else {
    iVar3 = (result->m_size).m_data[0];
    y = 0;
    bVar6 = true;
    do {
      if (0 < iVar3) {
        iVar5 = 0;
        do {
          iVar3 = tcu::ConstPixelBufferAccess::getPixStencil(result,iVar5,y,0);
          uVar1 = (reference->
                  super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                  )._M_impl.super__Vector_impl_data._M_start[(result->m_size).m_data[0] * y + iVar5]
                  .m_status;
          if ((uVar1 & 4) == 0) {
LAB_003af7a6:
            color = &local_58;
            bVar2 = bVar6;
          }
          else {
            iVar4 = 0xff;
            if (((byte)uVar1 >> 3 & 1) == 0) {
              iVar4 = 0;
            }
            color = &local_48;
            bVar2 = false;
            if (iVar3 == iVar4) goto LAB_003af7a6;
          }
          bVar6 = bVar2;
          tcu::PixelBufferAccess::setPixel(errorImage,color,iVar5,y,0);
          iVar5 = iVar5 + 1;
          iVar3 = (result->m_size).m_data[0];
        } while (iVar5 < iVar3);
        iVar5 = (result->m_size).m_data[1];
      }
      y = y + 1;
    } while (y < iVar5);
  }
  return bVar6;
}

Assistant:

bool verifyStencilAttachment (const vector<PixelValue>&		reference,
							  const ConstPixelBufferAccess&	result,
							  const PixelBufferAccess&		errorImage)
{
	const Vec4	red		(1.0f, 0.0f, 0.0f, 1.0f);
	const Vec4	green	(0.0f, 1.0f, 0.0f, 1.0f);
	bool		ok		= true;

	DE_ASSERT(result.getWidth() * result.getHeight() == (int)reference.size());
	DE_ASSERT(result.getWidth() == errorImage.getWidth());
	DE_ASSERT(result.getHeight() == errorImage.getHeight());

	for (int y = 0; y < result.getHeight(); y++)
	for (int x = 0; x < result.getWidth(); x++)
	{
		bool pixelOk = true;

		const deUint32		resultStencil	= result.getPixStencil(x, y);
		const PixelValue&	referenceValue	= reference[x + y * result.getWidth()];
		const Maybe<bool>	maybeValue		= referenceValue.getValue(1);

		if (maybeValue)
		{
			const bool value = *maybeValue;

			if ((value && (resultStencil != 0xFFu))
				|| (!value && resultStencil != 0x0u))
				pixelOk = false;
		}

		if (!pixelOk)
		{
			errorImage.setPixel(red, x, y);
			ok = false;
		}
		else
			errorImage.setPixel(green, x, y);
	}

	return ok;
}